

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

double ibeta_appx(double x,double a,double b)

{
  char *__format;
  double dVar1;
  double dVar2;
  double dVar3;
  
  if ((x < 0.0) || (1.0 < x)) {
    __format = "x only accepts real values between 0.0 and 1.0";
  }
  else {
    if ((0.0 <= a) && (0.0 <= b)) {
      dVar2 = 1.0;
      dVar3 = 1.0 - x;
      dVar1 = (a + b + -1.0) * dVar3;
      if (dVar1 <= 0.8) {
        dVar2 = pgamma((dVar1 * (3.0 - x) - dVar3 * (b + -1.0)) * 0.5,b);
        dVar2 = 1.0 - dVar2;
      }
      else if (0.8 < dVar1) {
        dVar2 = pow(x * b,0.3333333333333333);
        dVar1 = pow(dVar3 * a,0.3333333333333333);
        dVar3 = (dVar1 * dVar1) / a + (dVar2 * dVar2) / b;
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        dVar2 = erfc(((((1.0 - 1.0 / (b * 9.0)) * dVar2 - (1.0 - 1.0 / (a * 9.0)) * dVar1) * -3.0) /
                     1.4142135623730951) / dVar3);
        dVar2 = dVar2 * 0.5;
      }
      return dVar2;
    }
    __format = " The Two Inputs should be nonnegative and real";
  }
  printf(__format);
  exit(1);
}

Assistant:

double ibeta_appx(double x, double a , double b) {
	double oup,abx,c2,w1,w2,num,den;
	/*
	 * Method 2. uses approximation and is based on equations 26.5.20 
	 * (pgamma/qgamma) and 26.5.21 (erf)
	 */ 
	 
	 if (x < 0. || x > 1.) {
		printf("x only accepts real values between 0.0 and 1.0");
		exit(1);
	}
	if (a < 0. || b < 0.) {
		printf(" The Two Inputs should be nonnegative and real");
		exit(1);
	}
	abx = (a+b-1) *(1.-x);
	if ( abx <= 0.8) {
		c2 = (abx * (3. - x) - (b - 1.) *(1. - x))/2.0;
		oup = qgamma(c2,b); //Incomplete Gamma Function Upper Tail
	} else if (abx > 0.8) {
		w1 = pow(b*x, (double) 1./3.);
		w2 = pow(a*(1. - x), (double) 1./3.);
		num = - 3.0 * (w1 * (1. - 1./(9. * b)) - w2 * (1. - 1./ (9. * a)))/sqrt(2);
		den = sqrt((w1 * w1 / b) + (w2 * w2 / a) ); 
		oup = erfc(num/den) / 2.0;
	}
	 
	return oup;
	
}